

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.h
# Opt level: O2

char * Varint::Parse32FallbackInline(char *p,uint32 *OUTPUT)

{
  uint uVar1;
  char *pcVar2;
  
  if (-1 < *p) {
    __assert_fail("byte >= 128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.h"
                  ,0xb7,"static const char *Varint::Parse32FallbackInline(const char *, uint32 *)");
  }
  uVar1 = ((byte)p[1] & 0x7f) << 7 | (byte)*p & 0x7f;
  if (p[1] < '\0') {
    uVar1 = uVar1 | ((byte)p[2] & 0x7f) << 0xe;
    if (p[2] < '\0') {
      uVar1 = uVar1 | ((byte)p[3] & 0x7f) << 0x15;
      if (p[3] < '\0') {
        if (0xf < (byte)p[4]) {
          return (char *)0x0;
        }
        pcVar2 = p + 5;
        uVar1 = uVar1 | (uint)(byte)p[4] << 0x1c;
      }
      else {
        pcVar2 = p + 4;
      }
    }
    else {
      pcVar2 = p + 3;
    }
  }
  else {
    pcVar2 = p + 2;
  }
  *OUTPUT = uVar1;
  return pcVar2;
}

Assistant:

inline const char* Varint::Parse32FallbackInline(const char* p,
                                                 uint32* OUTPUT) {
  // Fast path
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  uint32 byte, result;
  byte = *(ptr++); result = byte & 127;
  assert(byte >= 128);   // Already checked in inlined prelude
  byte = *(ptr++); result |= (byte & 127) <<  7; if (byte < 128) goto done;
  byte = *(ptr++); result |= (byte & 127) << 14; if (byte < 128) goto done;
  byte = *(ptr++); result |= (byte & 127) << 21; if (byte < 128) goto done;
  byte = *(ptr++); result |= (byte & 127) << 28; if (byte < 16) goto done;
  return nullptr;       // Value is too long to be a varint32
 done:
  *OUTPUT = result;
  return reinterpret_cast<const char*>(ptr);
}